

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion.cpp
# Opt level: O1

quaternion_t * opengv::math::rot2quaternion(quaternion_t *__return_storage_ptr__,rotation_t *R)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar18 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [64];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar20 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  dVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar7;
  dVar36 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [4];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar36;
  dVar6 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  auVar31._8_8_ = dVar6;
  auVar31._0_8_ = dVar6;
  dVar21 = (dVar7 + dVar36 + dVar6 + 1.0) * 0.25;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[0] = dVar21;
  dVar7 = (((dVar7 - dVar36) - dVar6) + 1.0) * 0.25;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[1] = dVar7;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar5 = vxorpd_avx512vl(auVar8,auVar5);
  auVar5 = vunpcklpd_avx(auVar26,auVar5);
  auVar13 = vunpcklpd_avx(auVar8,auVar26);
  auVar5 = vsubpd_avx(auVar5,auVar13);
  auVar5 = vaddsubpd_avx(auVar5,auVar31);
  auVar13._8_8_ = 0x3ff0000000000000;
  auVar13._0_8_ = 0x3ff0000000000000;
  auVar5 = vaddpd_avx512vl(auVar5,auVar13);
  auVar1._8_8_ = 0x3fd0000000000000;
  auVar1._0_8_ = 0x3fd0000000000000;
  auVar5 = vmulpd_avx512vl(auVar5,auVar1);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array + 2) = auVar5;
  if (dVar21 < 0.0) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[0] = 0.0;
  }
  if (dVar7 < 0.0) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[1] = 0.0;
  }
  if (auVar5._0_8_ < 0.0) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[2] = 0.0;
  }
  auVar5 = vshufpd_avx(auVar5,auVar5,1);
  if (auVar5._0_8_ < 0.0) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[3] = 0.0;
  }
  dVar7 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
          m_storage.m_data.array[0];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar7;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    auVar5 = vsqrtsd_avx(auVar9,auVar9);
    dVar7 = auVar5._0_8_;
  }
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[0] = dVar7;
  dVar7 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
          m_storage.m_data.array[1];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar7;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    auVar5 = vsqrtsd_avx(auVar10,auVar10);
    dVar7 = auVar5._0_8_;
  }
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[1] = dVar7;
  dVar7 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
          m_storage.m_data.array[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar7;
  if (dVar7 < 0.0) {
    auVar19._0_8_ = sqrt(dVar7);
    auVar19._8_56_ = extraout_var;
    auVar5 = auVar19._0_16_;
  }
  else {
    auVar5 = vsqrtsd_avx(auVar11,auVar11);
  }
  dVar36 = auVar5._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[2] = dVar36;
  dVar7 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
          m_storage.m_data.array[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar7;
  if (dVar7 < 0.0) {
    auVar20._0_8_ = sqrt(dVar7);
    auVar20._8_56_ = extraout_var_00;
    auVar13 = auVar20._0_16_;
  }
  else {
    auVar13 = vsqrtsd_avx(auVar12,auVar12);
  }
  dVar6 = auVar13._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[3] = dVar6;
  auVar1 = *(undefined1 (*) [16])
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
            m_storage.m_data.array;
  dVar7 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
          m_storage.m_data.array[1];
  dVar21 = auVar1._0_8_;
  if (((dVar21 < dVar7) || (dVar21 < dVar36)) || (dVar21 < dVar6)) {
    if (((dVar21 <= dVar7) && (dVar36 <= dVar7)) && (dVar6 <= dVar7)) {
      dVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] -
              (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7];
      auVar34._8_8_ = 0x7fffffffffffffff;
      auVar34._0_8_ = 0x7fffffffffffffff;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar7;
      auVar1 = vandpd_avx(auVar27,auVar34);
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array[0] = dVar21 * (dVar7 / auVar1._0_8_);
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [1];
      auVar1 = vunpcklpd_avx(auVar23,*(undefined1 (*) [16])
                                      ((R->
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                       .m_storage.m_data.array + 6));
      auVar8 = vpermilpd_avx(*(undefined1 (*) [16])
                              ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array + 2),1);
      auVar24._0_8_ = auVar1._0_8_ + auVar8._0_8_;
      auVar24._8_8_ = auVar1._8_8_ + auVar8._8_8_;
      auVar1 = vandpd_avx(auVar24,auVar34);
      auVar1 = vdivpd_avx(auVar24,auVar1);
      auVar5 = vunpcklpd_avx(auVar5,auVar13);
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array[2] = auVar5._0_8_ * auVar1._0_8_;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array[3] = auVar5._8_8_ * auVar1._8_8_;
      goto LAB_001f480c;
    }
    dVar36 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
             m_storage.m_data.array[2];
    if (((dVar36 < dVar21) || (dVar36 < dVar7)) || (dVar36 < dVar6)) {
      if (((dVar21 <= dVar6) && (dVar7 <= dVar6)) && (dVar36 <= dVar6)) {
        auVar5 = *(undefined1 (*) [16])
                  ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array + 1);
        auVar13 = vsubpd_avx(auVar5,*(undefined1 (*) [16])
                                     ((R->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                      m_storage.m_data.array + 3));
        dVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[6];
        auVar4._8_8_ = dVar7;
        auVar4._0_8_ = dVar7;
        auVar5 = vaddpd_avx512vl(auVar5,auVar4);
        auVar16._8_8_ = auVar5._8_8_;
        auVar16._0_8_ = auVar13._0_8_;
        auVar30._8_8_ = 0x7fffffffffffffff;
        auVar30._0_8_ = 0x7fffffffffffffff;
        auVar5 = vandpd_avx(auVar16,auVar30);
        auVar5 = vdivpd_avx(auVar16,auVar5);
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
        m_storage.m_data.array[0] = dVar21 * auVar5._0_8_;
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
        m_storage.m_data.array[1] = auVar1._8_8_ * auVar5._8_8_;
        dVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[5] +
                (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[7];
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar7;
        auVar5 = vandpd_avx(auVar17,auVar30);
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
        m_storage.m_data.array[2] = dVar36 * (dVar7 / auVar5._0_8_);
      }
      goto LAB_001f480c;
    }
    auVar5 = *(undefined1 (*) [16])
              ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array + 2);
    auVar13 = vsubpd_avx(*(undefined1 (*) [16])
                          ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 6),auVar5);
    dVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
            [1];
    auVar3._8_8_ = dVar7;
    auVar3._0_8_ = dVar7;
    auVar5 = vaddpd_avx512vl(auVar5,auVar3);
    auVar29._8_8_ = auVar5._8_8_;
    auVar29._0_8_ = auVar13._0_8_;
    auVar35._8_8_ = 0x7fffffffffffffff;
    auVar35._0_8_ = 0x7fffffffffffffff;
    auVar5 = vandpd_avx(auVar29,auVar35);
    auVar5 = vdivpd_avx(auVar29,auVar5);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[0] = dVar21 * auVar5._0_8_;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[1] = auVar1._8_8_ * auVar5._8_8_;
    dVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
            [5] + (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                  .array[7];
  }
  else {
    auVar13 = vmovhpd_avx(*(undefined1 (*) [16])
                           ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array + 7),
                          (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[2]);
    auVar8 = vsubpd_avx(*(undefined1 (*) [16])
                         ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array + 5),auVar13);
    auVar32._8_8_ = 0x7fffffffffffffff;
    auVar32._0_8_ = 0x7fffffffffffffff;
    auVar13 = vandpd_avx(auVar8,auVar32);
    auVar13 = vdivpd_avx(auVar8,auVar13);
    auVar5 = vshufpd_avx(auVar1,auVar5,1);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[1] = auVar5._0_8_ * auVar13._0_8_;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[2] = auVar5._8_8_ * auVar13._8_8_;
    dVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
            [1] - (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                  .array[3];
  }
  auVar33._8_8_ = 0x7fffffffffffffff;
  auVar33._0_8_ = 0x7fffffffffffffff;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar7;
  auVar5 = vandpd_avx(auVar22,auVar33);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[3] = dVar6 * (dVar7 / auVar5._0_8_);
LAB_001f480c:
  auVar2 = *(undefined1 (*) [32])
            (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
            m_storage.m_data.array;
  auVar14._0_8_ = auVar2._0_8_ * auVar2._0_8_;
  auVar14._8_8_ = auVar2._8_8_ * auVar2._8_8_;
  auVar5 = vshufpd_avx(auVar14,auVar14,1);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
       m_storage.m_data.array[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
       m_storage.m_data.array[2];
  auVar5 = vfmadd213sd_fma(auVar25,auVar25,auVar5);
  auVar5 = vfmadd231sd_fma(auVar5,auVar28,auVar28);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
       m_storage.m_data.array[3];
  auVar5 = vfmadd213sd_fma(auVar15,auVar15,auVar5);
  if (auVar5._0_8_ < 0.0) {
    dVar7 = sqrt(auVar5._0_8_);
  }
  else {
    auVar5 = vsqrtsd_avx(auVar5,auVar5);
    dVar7 = auVar5._0_8_;
  }
  auVar18._8_8_ = dVar7;
  auVar18._0_8_ = dVar7;
  auVar18._16_8_ = dVar7;
  auVar18._24_8_ = dVar7;
  auVar2 = vdivpd_avx(auVar2,auVar18);
  *(undefined1 (*) [32])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
   m_data.array = auVar2;
  return __return_storage_ptr__;
}

Assistant:

opengv::quaternion_t
opengv::math::rot2quaternion( const rotation_t & R )
{
  quaternion_t q;
    
  q[0] = ( R(0,0) + R(1,1) + R(2,2) + 1.0) / 4.0;
  q[1] = ( R(0,0) - R(1,1) - R(2,2) + 1.0) / 4.0;
  q[2] = (-R(0,0) + R(1,1) - R(2,2) + 1.0) / 4.0;
  q[3] = (-R(0,0) - R(1,1) + R(2,2) + 1.0) / 4.0;
  if(q[0] < 0.0) q[0] = 0.0;
  if(q[1] < 0.0) q[1] = 0.0;
  if(q[2] < 0.0) q[2] = 0.0;
  if(q[3] < 0.0) q[3] = 0.0;
  q[0] = sqrt(q[0]);
  q[1] = sqrt(q[1]);
  q[2] = sqrt(q[2]);
  q[3] = sqrt(q[3]);
  if(q[0] >= q[1] && q[0] >= q[2] && q[0] >= q[3])
  {
    q[0] *= +1.0;
    q[1] *= ((R(2,1)-R(1,2))/fabs(R(2,1)-R(1,2)));
    q[2] *= ((R(0,2)-R(2,0))/fabs(R(0,2)-R(2,0)));
    q[3] *= ((R(1,0)-R(0,1))/fabs(R(1,0)-R(0,1)));
  }
  else if(q[1] >= q[0] && q[1] >= q[2] && q[1] >= q[3])
  {
    q[0] *= ((R(2,1)-R(1,2))/fabs(R(2,1)-R(1,2)));
    q[1] *= +1.0;
    q[2] *= ((R(1,0)+R(0,1))/fabs(R(1,0)+R(0,1)));
    q[3] *= ((R(0,2)+R(2,0))/fabs(R(0,2)+R(2,0)));
  }
  else if(q[2] >= q[0] && q[2] >= q[1] && q[2] >= q[3])
  {
    q[0] *= ((R(0,2)-R(2,0))/fabs(R(0,2)-R(2,0)));
    q[1] *= ((R(1,0)+R(0,1))/fabs(R(1,0)+R(0,1)));
    q[2] *= +1.0;
    q[3] *= ((R(2,1)+R(1,2))/fabs(R(2,1)+R(1,2)));
  }
  else if(q[3] >= q[0] && q[3] >= q[1] && q[3] >= q[2])
  {
    q[0] *= ((R(1,0)-R(0,1))/fabs(R(1,0)-R(0,1)));
    q[1] *= ((R(2,0)+R(0,2))/fabs(R(2,0)+R(0,2)));
    q[2] *= ((R(2,1)+R(1,2))/fabs(R(2,1)+R(1,2)));  
    q[3] *= +1.0;
  }
  else
    {};/*std::cout << "quaternion error" << std::endl;*/
  
  double scale = sqrt(q[0]*q[0]+q[1]*q[1]+q[2]*q[2]+q[3]*q[3]);
  q[0] /= scale;
  q[1] /= scale;
  q[2] /= scale;
  q[3] /= scale;
  
  return q;
}